

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.h
# Opt level: O2

bool __thiscall google::protobuf::FieldDescriptor::is_repeated(FieldDescriptor *this)

{
  Nullable<const_char_*> failure_msg;
  bool local_19;
  LogMessageFatal local_18;
  
  local_18.super_LogMessage.errno_saver_.saved_errno_._0_1_ = (byte)this->field_0x1 >> 5 & 1;
  local_19 = 0xbf < (byte)this->field_0x1;
  failure_msg = absl::lts_20250127::log_internal::Check_EQImpl<bool,bool>
                          ((bool *)&local_18,&local_19,
                           "is_repeated_ == static_cast<Label>(label_) == LABEL_REPEATED");
  if (failure_msg == (Nullable<const_char_*>)0x0) {
    return (bool)((this->field_0x1 & 0x20) >> 5);
  }
  absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
            (&local_18,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.h"
             ,0xb54,failure_msg);
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal(&local_18);
}

Assistant:

inline bool FieldDescriptor::is_repeated() const {
  ABSL_DCHECK_EQ(is_repeated_, static_cast<Label>(label_) == LABEL_REPEATED);
  return is_repeated_;
}